

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretOr
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  bool bVar1;
  value_type vVar2;
  int iVar3;
  size_type sVar4;
  Trace *this_00;
  anon_union_8_2_3d487603_for_CharStringOperand_1 *paVar5;
  reference pvVar6;
  double local_88;
  double local_78;
  undefined1 local_60 [8];
  CharStringOperand newOperand;
  CharStringOperand valueB;
  CharStringOperand valueA;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  iVar3 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x1c])();
  if (iVar3 == 0) {
    local_60[0] = true;
    sVar4 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                      (&this->mOperandStack);
    if (sVar4 < 2) {
      this_00 = Trace::DefaultTrace();
      sVar4 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                        (&this->mOperandStack);
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretOr, or should have at least 2 arguments on stack. got %d. aborting"
                        ,sVar4);
      this_local = (CharStringType2Interpreter *)0x0;
    }
    else {
      paVar5 = (anon_union_8_2_3d487603_for_CharStringOperand_1 *)
               std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      newOperand.field_1 = *paVar5;
      local_78 = paVar5[1].RealValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      pvVar6 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      vVar2 = *pvVar6;
      local_88 = (pvVar6->field_1).RealValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      if ((newOperand.field_1.IntegerValue & 1U) != 0) {
        local_78 = (double)(long)local_78;
      }
      bVar1 = true;
      if ((local_78 == 0.0) && (!NAN(local_78))) {
        if (((undefined1  [16])vVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_88 = (double)(long)local_88;
        }
        bVar1 = local_88 != 0.0;
      }
      newOperand._0_8_ = SEXT48((int)(uint)bVar1);
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,(value_type *)local_60);
      this_local = (CharStringType2Interpreter *)inProgramCounter;
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretOr(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Or(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;
	newOperand.IsInteger = true;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretOr, or should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	newOperand.IntegerValue = (
		(valueB.IsInteger ? valueB.IntegerValue : valueB.RealValue) ||
		(valueA.IsInteger ? valueA.IntegerValue : valueA.RealValue)
		) ? 1:0;	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}